

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

wchar_t find_joinfree_vertical_seam
                  (connector *join,wchar_t colpref,wchar_t range,wchar_t rowmin,wchar_t rowmax)

{
  void *p;
  wchar_t local_48;
  wchar_t local_44;
  wchar_t local_3c;
  _Bool *disallowed;
  wchar_t local_28;
  wchar_t i;
  wchar_t result;
  wchar_t metric;
  wchar_t rowmax_local;
  wchar_t rowmin_local;
  wchar_t range_local;
  wchar_t colpref_local;
  connector *join_local;
  
  i = range + L'\x01';
  local_28 = L'\xffffffff';
  if (range < L'\0') {
    __assert_fail("range >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                  ,0x3e5,
                  "int find_joinfree_vertical_seam(const struct connector *, int, int, int, int)");
  }
  p = mem_zalloc((long)(range * 2 + 1));
  for (_range_local = join; _range_local != (connector *)0x0; _range_local = _range_local->next) {
    if ((_range_local->grid).x - colpref < 0) {
      local_3c = -((_range_local->grid).x - colpref);
    }
    else {
      local_3c = (_range_local->grid).x - colpref;
    }
    if (((local_3c <= range) && (rowmin <= (_range_local->grid).y)) &&
       ((_range_local->grid).y <= rowmax)) {
      *(undefined1 *)((long)p + (long)((range + (_range_local->grid).x) - colpref)) = 1;
    }
  }
  disallowed._4_4_ = 0;
  while (disallowed._4_4_ < range * 2) {
    if ((*(byte *)((long)p + (long)disallowed._4_4_) & 1) == 0) {
      if ((*(byte *)((long)p + (long)(disallowed._4_4_ + 1)) & 1) == 0) {
        if (disallowed._4_4_ - range < 0) {
          local_44 = -(disallowed._4_4_ - range);
        }
        else {
          local_44 = disallowed._4_4_ - range;
        }
        if (local_44 < i) {
          if (disallowed._4_4_ - range < 0) {
            local_48 = -(disallowed._4_4_ - range);
          }
          else {
            local_48 = disallowed._4_4_ - range;
          }
          i = local_48;
          local_28 = (colpref + disallowed._4_4_) - range;
        }
        disallowed._4_4_ = disallowed._4_4_ + 1;
      }
      else {
        disallowed._4_4_ = disallowed._4_4_ + 2;
      }
    }
    else {
      disallowed._4_4_ = disallowed._4_4_ + 1;
    }
  }
  mem_free(p);
  return local_28;
}

Assistant:

static int find_joinfree_vertical_seam(const struct connector *join,
		int colpref, int range, int rowmin, int rowmax)
{
	int metric = range + 1;
	int result = -1;
	int i;
	/* Remember which columns in the range had a connector. */
	bool *disallowed;

	assert(range >= 0);
	disallowed = mem_zalloc((range + range + 1) * sizeof(*disallowed));

	/*
	 * Scan the connections and record the columns that can't be in a
	 * seam.
	 */
	for (; join; join = join->next) {
		if (ABS(join->grid.x - colpref) <= range &&
				join->grid.y >= rowmin &&
				join->grid.y <= rowmax) {
			disallowed[range + join->grid.x - colpref] = true;
		}
	}

	/*
	 * Find the pair of adjacent columns that are allowed and are closest
	 * to colpref.
	 */
	i = 0;
	while (i < range + range) {
		if (!disallowed[i]) {
			if (!disallowed[i + 1]) {
				if (metric > ABS(i - range)) {
					metric = ABS(i - range);
					result = colpref + i - range;
				}
				++i;
			} else {
				i += 2;
			}
		} else {
			++i;
		}
	}

	mem_free(disallowed);

	return result;
}